

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

LY_ERR lydjson_get_node_prefix
                 (lyd_node *node,char *param_2,size_t param_3,char **prefix_p,size_t *prefix_len_p)

{
  size_t local_50;
  char *local_48;
  char *module_name;
  lyd_node_opaq *onode;
  size_t *prefix_len_p_local;
  char **prefix_p_local;
  size_t local_prefix_len_local;
  char *local_prefix_local;
  lyd_node *node_local;
  
  local_48 = (char *)0x0;
  if ((prefix_p == (char **)0x0) || (prefix_len_p == (size_t *)0x0)) {
    __assert_fail("prefix_p && prefix_len_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x9c,
                  "LY_ERR lydjson_get_node_prefix(struct lyd_node *, const char *, size_t, const char **, size_t *)"
                 );
  }
  local_prefix_local = (char *)node;
  if (param_3 == 0) {
    for (; local_prefix_local != (char *)0x0;
        local_prefix_local = (char *)lyd_parent((lyd_node *)local_prefix_local)) {
      if (*(long *)(local_prefix_local + 8) != 0) {
        local_48 = *(char **)(*(long *)(*(long *)(local_prefix_local + 8) + 8) + 8);
        break;
      }
      if (*(long *)(local_prefix_local + 0x50) != 0) {
        local_48 = *(char **)(local_prefix_local + 0x50);
        break;
      }
      if (*(long *)(local_prefix_local + 0x48) != 0) {
        local_48 = *(char **)(local_prefix_local + 0x48);
        break;
      }
    }
    *prefix_p = local_48;
    if (local_48 == (char *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = strlen(local_48);
    }
    *prefix_len_p = local_50;
  }
  else {
    *prefix_p = param_2;
    *prefix_len_p = param_3;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lydjson_get_node_prefix(struct lyd_node *node, const char *local_prefix, size_t local_prefix_len, const char **prefix_p,
        size_t *prefix_len_p)
{
    struct lyd_node_opaq *onode;
    const char *module_name = NULL;

    assert(prefix_p && prefix_len_p);

    if (local_prefix_len) {
        *prefix_p = local_prefix;
        *prefix_len_p = local_prefix_len;
        return LY_SUCCESS;
    }

    while (node) {
        if (node->schema) {
            module_name = node->schema->module->name;
            break;
        }
        onode = (struct lyd_node_opaq *)node;
        if (onode->name.module_name) {
            module_name = onode->name.module_name;
            break;
        } else if (onode->name.prefix) {
            module_name = onode->name.prefix;
            break;
        }
        node = lyd_parent(node);
    }

    *prefix_p = module_name;
    *prefix_len_p = ly_strlen(module_name);
    return LY_SUCCESS;
}